

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_pool.h
# Opt level: O0

void mutex_pool_lock2(tsdn_t *tsdn,mutex_pool_t *pool,uintptr_t key1,uintptr_t key2)

{
  malloc_mutex_t *key;
  malloc_mutex_t *pmVar1;
  mutex_pool_t *in_RCX;
  tsdn_t *in_RDX;
  malloc_mutex_t *mutex2;
  malloc_mutex_t *mutex1;
  mutex_pool_t *in_stack_ffffffffffffffc8;
  tsdn_t *in_stack_ffffffffffffffd0;
  uintptr_t in_stack_ffffffffffffffd8;
  
  mutex_pool_assert_not_held(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  key = mutex_pool_mutex(in_RCX,in_stack_ffffffffffffffd8);
  pmVar1 = mutex_pool_mutex(in_RCX,(uintptr_t)key);
  if (key < pmVar1) {
    malloc_mutex_lock(in_RDX,in_RCX->mutexes);
    malloc_mutex_lock(in_RDX,in_RCX->mutexes);
  }
  else if (key == pmVar1) {
    malloc_mutex_lock(in_RDX,in_RCX->mutexes);
  }
  else {
    malloc_mutex_lock(in_RDX,in_RCX->mutexes);
    malloc_mutex_lock(in_RDX,in_RCX->mutexes);
  }
  return;
}

Assistant:

static inline void
mutex_pool_lock2(tsdn_t *tsdn, mutex_pool_t *pool, uintptr_t key1,
    uintptr_t key2) {
	mutex_pool_assert_not_held(tsdn, pool);

	malloc_mutex_t *mutex1 = mutex_pool_mutex(pool, key1);
	malloc_mutex_t *mutex2 = mutex_pool_mutex(pool, key2);
	if ((uintptr_t)mutex1 < (uintptr_t)mutex2) {
		malloc_mutex_lock(tsdn, mutex1);
		malloc_mutex_lock(tsdn, mutex2);
	} else if ((uintptr_t)mutex1 == (uintptr_t)mutex2) {
		malloc_mutex_lock(tsdn, mutex1);
	} else {
		malloc_mutex_lock(tsdn, mutex2);
		malloc_mutex_lock(tsdn, mutex1);
	}
}